

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emissive.cpp
# Opt level: O0

RGBColor __thiscall pm::Emissive::globalShade(Emissive *this,ShadeRecord *sr)

{
  long in_RDX;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  float fVar1;
  RGBColor RVar2;
  Vector3 local_2c;
  long local_20;
  ShadeRecord *sr_local;
  Emissive *this_local;
  
  sr_local = sr;
  this_local = this;
  if (*(int *)(in_RDX + 0x4c) == 1) {
    fVar1 = 0.0;
    RGBColor::RGBColor((RGBColor *)this,0.0,0.0,0.0);
    RVar2.b = fVar1;
    RVar2.r = (float)(int)extraout_XMM0_Qa;
    RVar2.g = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  else {
    local_20 = in_RDX;
    Vector3::operator-(&local_2c);
    fVar1 = dot(&local_2c,(Vector3 *)(local_20 + 0x40));
    if (fVar1 <= 0.0) {
      fVar1 = 0.0;
      RGBColor::RGBColor((RGBColor *)this,0.0,0.0,0.0);
      RVar2.b = fVar1;
      RVar2.r = (float)(int)extraout_XMM0_Qa_00;
      RVar2.g = (float)(int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    }
    else {
      RVar2 = operator*((pm *)this,*(float *)((long)&sr->material + 4),(RGBColor *)&sr->hitPoint);
    }
  }
  return RVar2;
}

Assistant:

RGBColor Emissive::globalShade(ShadeRecord &sr) const
{
	if (sr.depth == 1)
		return RGBColor(0.0f, 0.0f, 0.0f);

	if (dot(-sr.normal, sr.ray.d) > 0.0)
		return (ls_ * ce_);
	else
		return RGBColor(0.0f, 0.0f, 0.0f);
}